

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::StressTestConfig::Serialize(StressTestConfig *this,Message *msg)

{
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false> this_00;
  _Head_base<0UL,_perfetto::protos::gen::StressTestConfig_WriterTiming_*,_false> _Var1;
  uint8_t *src_begin;
  uint uVar2;
  Message *pMVar3;
  ulong uVar4;
  
  uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar4 & 2) != 0) {
    this_00._M_head_impl =
         (this->trace_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false>._M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,1);
    TraceConfig::Serialize(this_00._M_head_impl,pMVar3);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 4) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,2,this->shmem_size_kb_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 8) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->shmem_page_size_kb_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 0x10) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,4,this->num_processes_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar4 & 0x20) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,this->num_threads_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  uVar2 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->max_events_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((char)uVar2 < '\0') {
    protozero::Message::AppendVarInt<unsigned_int>(msg,7,this->nesting_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    _Var1._M_head_impl =
         (this->steady_state_timings_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::StressTestConfig_WriterTiming,_std::default_delete<perfetto::protos::gen::StressTestConfig_WriterTiming>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::StressTestConfig_WriterTiming_*,_std::default_delete<perfetto::protos::gen::StressTestConfig_WriterTiming>_>
         .super__Head_base<0UL,_perfetto::protos::gen::StressTestConfig_WriterTiming_*,_false>.
         _M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,8);
    StressTestConfig_WriterTiming::Serialize(_Var1._M_head_impl,pMVar3);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,9,this->burst_period_ms_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,10,this->burst_duration_ms_);
    uVar2 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    _Var1._M_head_impl =
         (this->burst_timings_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::StressTestConfig_WriterTiming,_std::default_delete<perfetto::protos::gen::StressTestConfig_WriterTiming>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::StressTestConfig_WriterTiming_*,_std::default_delete<perfetto::protos::gen::StressTestConfig_WriterTiming>_>
         .super__Head_base<0UL,_perfetto::protos::gen::StressTestConfig_WriterTiming_*,_false>.
         _M_head_impl;
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,0xb);
    StressTestConfig_WriterTiming::Serialize(_Var1._M_head_impl,pMVar3);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void StressTestConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: trace_config
  if (_has_field_[1]) {
    (*trace_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: shmem_size_kb
  if (_has_field_[2]) {
    msg->AppendVarInt(2, shmem_size_kb_);
  }

  // Field 3: shmem_page_size_kb
  if (_has_field_[3]) {
    msg->AppendVarInt(3, shmem_page_size_kb_);
  }

  // Field 4: num_processes
  if (_has_field_[4]) {
    msg->AppendVarInt(4, num_processes_);
  }

  // Field 5: num_threads
  if (_has_field_[5]) {
    msg->AppendVarInt(5, num_threads_);
  }

  // Field 6: max_events
  if (_has_field_[6]) {
    msg->AppendVarInt(6, max_events_);
  }

  // Field 7: nesting
  if (_has_field_[7]) {
    msg->AppendVarInt(7, nesting_);
  }

  // Field 8: steady_state_timings
  if (_has_field_[8]) {
    (*steady_state_timings_).Serialize(msg->BeginNestedMessage<::protozero::Message>(8));
  }

  // Field 9: burst_period_ms
  if (_has_field_[9]) {
    msg->AppendVarInt(9, burst_period_ms_);
  }

  // Field 10: burst_duration_ms
  if (_has_field_[10]) {
    msg->AppendVarInt(10, burst_duration_ms_);
  }

  // Field 11: burst_timings
  if (_has_field_[11]) {
    (*burst_timings_).Serialize(msg->BeginNestedMessage<::protozero::Message>(11));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}